

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  bool bVar1;
  element_type *peVar2;
  ArgExc *pAVar3;
  ostream *poVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  stringstream _iex_replace_s;
  BaseExc *e;
  stringstream _iex_throw_s;
  undefined1 in_stack_0000032b;
  int in_stack_0000032c;
  int in_stack_00000330;
  int in_stack_00000334;
  int in_stack_00000338;
  int in_stack_0000033c;
  Data *in_stack_00000340;
  int in_stack_00000350;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  DeepTiledInputFile *in_stack_fffffffffffffc58;
  stringstream local_1b8 [16];
  ostream local_1a8 [396];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  peVar2 = std::
           __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9f81);
  if ((peVar2->frameBufferValid & 1U) == 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar1 = isValidLevel(in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,in_stack_fffffffffffffc50
                      );
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Level coordinate (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_00000008);
    std::operator<<(poVar4,") is invalid.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,local_1b8);
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_10 < local_c[0]) {
    std::swap<int>(local_c,&local_10);
  }
  if (local_18 < local_14) {
    std::swap<int>(&local_14,&local_18);
  }
  std::
  __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1ba264);
  Data::readTiles(in_stack_00000340,in_stack_0000033c,in_stack_00000338,in_stack_00000334,
                  in_stack_00000330,in_stack_0000032c,in_stack_00000350,(bool)in_stack_0000032b);
  return;
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //
    try
    {
        if (!_data->frameBufferValid)
        {
            throw IEX_NAMESPACE::ArgExc (
                "readPixelSampleCounts called with no valid frame buffer");
        }

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        if (dx1 > dx2) std::swap (dx1, dx2);
        if (dy1 > dy2) std::swap (dy1, dy2);

        _data->readTiles (dx1, dx2, dy1, dy2, lx, ly, true);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading deep pixel sample counts data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}